

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v8::detail::write_int_noinline<char,fmt::v8::appender,unsigned__int128>
                   (appender out,write_int_arg<unsigned___int128> arg,
                   basic_format_specs<char> *specs,locale_ref loc)

{
  presentation_type pVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 value [16];
  undefined1 n [16];
  undefined1 value_00 [16];
  int iVar4;
  int iVar5;
  char *digits;
  appender aVar6;
  byte *pbVar7;
  char *pcVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  char *digits_1;
  char *pcVar13;
  char *pcVar14;
  detail *pdVar15;
  buffer<char> *buf;
  uint uVar16;
  long lVar17;
  appender it;
  long lVar18;
  bool bVar19;
  bool bVar20;
  format_decimal_result<char_*> fVar21;
  undefined1 local_d8 [8];
  char buffer [39];
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_38;
  
  pVar1 = specs->type;
  local_38 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  switch(pVar1) {
  case none:
  case dec:
    break;
  case oct:
    lVar18 = 0;
    lVar17 = 1;
    iVar5 = 0;
    uVar11 = arg.abs_value._8_8_;
    pdVar15 = (detail *)arg.abs_value;
    do {
      iVar5 = iVar5 + 1;
      uVar2 = uVar11 << 0x3d;
      lVar17 = lVar17 + -1;
      lVar18 = lVar18 + -1;
      bVar19 = (detail *)0x7 < pdVar15;
      bVar20 = uVar11 != 0;
      uVar3 = -uVar11;
      uVar11 = uVar11 >> 3;
      pdVar15 = (detail *)(uVar2 | (ulong)pdVar15 >> 3);
    } while (bVar20 || uVar3 < bVar19);
    iVar4 = specs->precision;
    if (((char)*(ushort *)&specs->field_0x9 < '\0') &&
       (((detail *)arg.abs_value != (detail *)0x0 || arg.abs_value._8_8_ != 0) && iVar4 <= iVar5)) {
      uVar16 = 0x3000;
      if (arg.prefix == 0) {
        uVar16 = 0x30;
      }
      arg.prefix = (uVar16 | arg.prefix) + 0x1000000;
    }
    uVar16 = specs->width;
    if (iVar4 == -1 && uVar16 == 0) {
      if ((arg.prefix != 0) && (uVar16 = arg.prefix & 0xffffff, uVar16 != 0)) {
        do {
          lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                   container + 0x10);
          uVar11 = lVar10 + 1;
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                               container + 0x18) < uVar11) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
            lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                     container + 0x10);
            uVar11 = lVar10 + 1;
          }
          *(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                    + 0x10) = uVar11;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                    container + 8) + lVar10) = (char)uVar16;
          bVar19 = 0xff < uVar16;
          uVar16 = uVar16 >> 8;
        } while (bVar19);
      }
      lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                               container + 0x10);
      uVar11 = lVar10 - lVar18;
      if (uVar11 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                     container + 0x18)) {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x10) = uVar11;
        if (*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 8) != 0) {
          pbVar7 = (byte *)((*(long *)((long)out.
                                             super_back_insert_iterator<fmt::v8::detail::buffer<char>_>
                                             .container + 8) + lVar10) - lVar17);
          do {
            uVar11 = arg.abs_value._8_8_ << 0x3d;
            *pbVar7 = (byte)(detail *)arg.abs_value & 7 | 0x30;
            pbVar7 = pbVar7 + -1;
            bVar19 = ((detail *)arg.abs_value < (detail *)0x8) <= arg.abs_value._8_8_;
            arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
            arg.abs_value._0_8_ = (detail *)(uVar11 | (ulong)(detail *)arg.abs_value >> 3);
          } while (bVar19);
          return (appender)
                 out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
        }
      }
      pbVar7 = local_d8 + -lVar17;
      pcVar8 = local_d8 + -lVar18;
      do {
        *pbVar7 = (byte)(detail *)arg.abs_value & 7 | 0x30;
        uVar11 = arg.abs_value._8_8_ << 0x3d;
        pbVar7 = pbVar7 + -1;
        bVar19 = (detail *)0x7 < (detail *)arg.abs_value;
        bVar20 = arg.abs_value._8_8_ != 0;
        uVar2 = -arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
        arg.abs_value._0_8_ = (detail *)(uVar11 | (ulong)(detail *)arg.abs_value >> 3);
      } while (bVar20 || uVar2 < bVar19);
      goto LAB_0019ea27;
    }
    uVar12 = (arg.prefix >> 0x18) + iVar5;
    buffer._0_8_ = ZEXT48(uVar12);
    if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
      if (uVar12 < uVar16) {
        buffer._8_8_ = (ulong)uVar16 - buffer._0_8_;
        buffer._0_8_ = (ulong)uVar16;
        goto LAB_0019e9a6;
      }
    }
    else {
      buffer._8_8_ = ZEXT48((uint)(iVar4 - iVar5));
      if (iVar4 - iVar5 != 0 && iVar5 <= iVar4) {
        buffer._0_8_ = ZEXT48(iVar4 + (arg.prefix >> 0x18));
        goto LAB_0019e9a6;
      }
    }
    buffer._8_8_ = 0;
LAB_0019e9a6:
    buffer._24_8_ = (detail *)arg.abs_value;
    stack0xffffffffffffff50 = arg.abs_value._8_8_;
    local_d8._0_4_ = arg.prefix;
    aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_)::_lambda(fmt::v8::appender)_1_&>
                      (out,specs,buffer._0_8_,buffer._0_8_,(anon_class_64_3_4ecd7a16 *)local_d8);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  case hex_lower:
  case hex_upper:
    if ((char)*(ushort *)&specs->field_0x9 < '\0') {
      uVar12 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar16 = uVar12 << 8;
      if (arg.prefix == 0) {
        uVar16 = uVar12;
      }
      arg.prefix = (uVar16 | arg.prefix) + 0x2000000;
    }
    uVar11 = arg.abs_value._8_8_;
    pdVar15 = (detail *)arg.abs_value;
    lVar17 = 0;
    do {
      lVar18 = lVar17;
      uVar2 = uVar11 << 0x3c;
      lVar17 = lVar18 + 1;
      bVar19 = (detail *)0xf < pdVar15;
      bVar20 = uVar11 != 0;
      uVar3 = -uVar11;
      uVar11 = uVar11 >> 4;
      pdVar15 = (detail *)(uVar2 | (ulong)pdVar15 >> 4);
    } while (bVar20 || uVar3 < bVar19);
    uVar16 = specs->width;
    iVar5 = specs->precision;
    if (iVar5 == -1 && uVar16 == 0) {
      if ((arg.prefix != 0) && (uVar16 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
        do {
          lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                   container + 0x10);
          uVar11 = lVar10 + 1;
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                               container + 0x18) < uVar11) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
            lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                     container + 0x10);
            uVar11 = lVar10 + 1;
          }
          *(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                    + 0x10) = uVar11;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                    container + 8) + lVar10) = (char)uVar16;
          bVar19 = 0xff < uVar16;
          uVar16 = uVar16 >> 8;
        } while (bVar19);
      }
      lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                               container + 0x10);
      uVar11 = lVar10 + lVar17;
      if (uVar11 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                     container + 0x18)) {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x10) = uVar11;
        if (*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 8) != 0) {
          pcVar8 = "0123456789abcdef";
          if (pVar1 == hex_upper) {
            pcVar8 = "0123456789ABCDEF";
          }
          pcVar13 = (char *)(*(long *)((long)out.
                                             super_back_insert_iterator<fmt::v8::detail::buffer<char>_>
                                             .container + 8) + lVar10 + lVar17);
          do {
            pcVar13 = pcVar13 + -1;
            uVar11 = arg.abs_value._8_8_ << 0x3c;
            *pcVar13 = pcVar8[(uint)(detail *)arg.abs_value & 0xf];
            bVar19 = ((detail *)arg.abs_value < (detail *)0x10) <= arg.abs_value._8_8_;
            arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
            arg.abs_value._0_8_ = (detail *)(uVar11 | (ulong)(detail *)arg.abs_value >> 4);
          } while (bVar19);
          return (appender)
                 out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
        }
      }
      pcVar13 = local_d8 + lVar18;
      pcVar8 = local_d8 + lVar18 + 1;
      pcVar14 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar14 = "0123456789ABCDEF";
      }
      do {
        *pcVar13 = pcVar14[(uint)(detail *)arg.abs_value & 0xf];
        uVar11 = arg.abs_value._8_8_ << 0x3c;
        pcVar13 = pcVar13 + -1;
        bVar19 = (detail *)0xf < (detail *)arg.abs_value;
        bVar20 = arg.abs_value._8_8_ != 0;
        uVar2 = -arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
        arg.abs_value._0_8_ = (detail *)(uVar11 | (ulong)(detail *)arg.abs_value >> 4);
      } while (bVar20 || uVar2 < bVar19);
      goto LAB_0019ea27;
    }
    uVar12 = arg.prefix >> 0x18;
    buffer._0_8_ = (ulong)uVar12 + lVar17;
    if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
      if ((uint)buffer._0_8_ < uVar16) {
        buffer._8_8_ = ((ulong)uVar16 - (ulong)uVar12) - lVar17;
        buffer._0_8_ = (ulong)uVar16;
        goto LAB_0019e74c;
      }
    }
    else if ((int)lVar17 < iVar5) {
      buffer._0_8_ = ZEXT48(uVar12 + iVar5);
      buffer._8_8_ = ZEXT48((uint)(iVar5 - (int)lVar17));
      goto LAB_0019e74c;
    }
    buffer._8_8_ = 0;
LAB_0019e74c:
    buffer._24_8_ = (detail *)arg.abs_value;
    stack0xffffffffffffff50 = arg.abs_value._8_8_;
    local_d8._0_4_ = arg.prefix;
    aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_)::_lambda(fmt::v8::appender)_1_&>
                      (out,specs,buffer._0_8_,buffer._0_8_,(anon_class_64_3_4ecd7a16 *)local_d8);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  case bin_lower:
  case bin_upper:
    if ((char)*(ushort *)&specs->field_0x9 < '\0') {
      uVar12 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar16 = uVar12 << 8;
      if (arg.prefix == 0) {
        uVar16 = uVar12;
      }
      arg.prefix = (uVar16 | arg.prefix) + 0x2000000;
    }
    uVar11 = arg.abs_value._8_8_;
    pdVar15 = (detail *)arg.abs_value;
    lVar17 = 0;
    do {
      lVar18 = lVar17;
      uVar2 = uVar11 << 0x3f;
      lVar17 = lVar18 + 1;
      bVar19 = (detail *)0x1 < pdVar15;
      bVar20 = uVar11 != 0;
      uVar3 = -uVar11;
      uVar11 = uVar11 >> 1;
      pdVar15 = (detail *)(uVar2 | (ulong)pdVar15 >> 1);
    } while (bVar20 || uVar3 < bVar19);
    uVar16 = specs->width;
    iVar5 = specs->precision;
    if (iVar5 == -1 && uVar16 == 0) {
      if ((arg.prefix != 0) && (uVar16 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
        do {
          lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                   container + 0x10);
          uVar11 = lVar10 + 1;
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                               container + 0x18) < uVar11) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
            lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                     container + 0x10);
            uVar11 = lVar10 + 1;
          }
          *(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                    + 0x10) = uVar11;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                    container + 8) + lVar10) = (char)uVar16;
          bVar19 = 0xff < uVar16;
          uVar16 = uVar16 >> 8;
        } while (bVar19);
      }
      lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                               container + 0x10);
      uVar11 = lVar10 + lVar17;
      if (uVar11 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                     container + 0x18)) {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x10) = uVar11;
        if (*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 8) != 0) {
          pbVar7 = (byte *)(*(long *)((long)out.
                                            super_back_insert_iterator<fmt::v8::detail::buffer<char>_>
                                            .container + 8) + lVar10 + lVar17);
          do {
            pbVar7 = pbVar7 + -1;
            uVar11 = arg.abs_value._8_8_ << 0x3f;
            *pbVar7 = (byte)(detail *)arg.abs_value & 1 | 0x30;
            bVar19 = ((detail *)arg.abs_value < (detail *)0x2) <= arg.abs_value._8_8_;
            arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
            arg.abs_value._0_8_ = (detail *)(uVar11 | (ulong)(detail *)arg.abs_value >> 1);
          } while (bVar19);
          return (appender)
                 out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
        }
      }
      pbVar7 = local_d8 + lVar18;
      pcVar8 = local_d8 + lVar18 + 1;
      do {
        *pbVar7 = (byte)(detail *)arg.abs_value & 1 | 0x30;
        uVar11 = arg.abs_value._8_8_ << 0x3f;
        pbVar7 = pbVar7 + -1;
        bVar19 = (detail *)0x1 < (detail *)arg.abs_value;
        bVar20 = arg.abs_value._8_8_ != 0;
        uVar2 = -arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
        arg.abs_value._0_8_ = (detail *)(uVar11 | (ulong)(detail *)arg.abs_value >> 1);
      } while (bVar20 || uVar2 < bVar19);
      goto LAB_0019ea27;
    }
    uVar12 = arg.prefix >> 0x18;
    buffer._0_8_ = (ulong)uVar12 + lVar17;
    if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
      if ((uint)buffer._0_8_ < uVar16) {
        buffer._8_8_ = ((ulong)uVar16 - (ulong)uVar12) - lVar17;
        buffer._0_8_ = (ulong)uVar16;
        goto LAB_0019e709;
      }
    }
    else if ((int)lVar17 < iVar5) {
      buffer._0_8_ = ZEXT48(uVar12 + iVar5);
      buffer._8_8_ = ZEXT48((uint)(iVar5 - (int)lVar17));
      goto LAB_0019e709;
    }
    buffer._8_8_ = 0;
LAB_0019e709:
    buffer._24_8_ = (detail *)arg.abs_value;
    stack0xffffffffffffff50 = arg.abs_value._8_8_;
    local_d8._0_4_ = arg.prefix;
    aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_)::_lambda(fmt::v8::appender)_1_&>
                      (out,specs,buffer._0_8_,buffer._0_8_,(anon_class_64_3_4ecd7a16 *)local_d8);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  default:
    throw_format_error("invalid type specifier");
  case chr:
    local_d8[0] = (char)arg.abs_value;
    aVar6 = write_padded<(fmt::v8::align::type)1,fmt::v8::appender,char,fmt::v8::detail::write_char<char,fmt::v8::appender>(fmt::v8::appender,char,fmt::v8::basic_format_specs<char>const&)::_lambda(fmt::v8::appender)_1_&>
                      (out,specs,1,1,(anon_class_1_1_a8c68091 *)local_d8);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  if (((specs->field_0xa & 1) != 0) &&
     (value._4_4_ = local_d8._4_4_, value._0_4_ = local_d8._0_4_, value._8_8_ = buffer._0_8_,
     bVar19 = write_int_localized<fmt::v8::appender,unsigned__int128,char>
                        ((detail *)&local_38,(appender *)(detail *)arg.abs_value,
                         (unsigned___int128)value,arg.abs_value._8_4_,
                         (basic_format_specs<char> *)(ulong)arg.prefix,(locale_ref)specs), bVar19))
  {
    return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_38.container;
  }
  n._4_4_ = local_d8._4_4_;
  n._0_4_ = local_d8._0_4_;
  n[8] = buffer[0];
  n[9] = buffer[1];
  n[10] = buffer[2];
  n[0xb] = buffer[3];
  n[0xc] = buffer[4];
  n[0xd] = buffer[5];
  n[0xe] = buffer[6];
  n[0xf] = buffer[7];
  iVar4 = count_digits_fallback<unsigned__int128>((detail *)arg.abs_value,(unsigned___int128)n);
  out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
       (back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_38.container;
  uVar16 = specs->width;
  iVar5 = specs->precision;
  if (iVar5 == -1 && uVar16 == 0) {
    if ((arg.prefix != 0) &&
       (uVar16 = arg.prefix & 0xffffff,
       ((undefined1  [32])arg & (undefined1  [32])0xffffff) != (undefined1  [32])0x0)) {
      do {
        sVar9 = ((buffer<char> *)
                out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)->size_;
        uVar11 = sVar9 + 1;
        if (((buffer<char> *)
            out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)->capacity_ <
            uVar11) {
          (**((buffer<char> *)
             out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)->_vptr_buffer
          )(out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
          sVar9 = ((buffer<char> *)
                  out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)->size_;
          uVar11 = sVar9 + 1;
        }
        ((buffer<char> *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)->
        size_ = uVar11;
        ((buffer<char> *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)->
        ptr_[sVar9] = (char)uVar16;
        bVar19 = 0xff < uVar16;
        uVar16 = uVar16 >> 8;
      } while (bVar19);
    }
    value_00._4_4_ = local_d8._4_4_;
    value_00._0_4_ = local_d8._0_4_;
    value_00[8] = buffer[0];
    value_00[9] = buffer[1];
    value_00[10] = buffer[2];
    value_00[0xb] = buffer[3];
    value_00[0xc] = buffer[4];
    value_00[0xd] = buffer[5];
    value_00[0xe] = buffer[6];
    value_00[0xf] = buffer[7];
    fVar21 = format_decimal<char,unsigned__int128>
                       ((detail *)local_d8,(char *)(detail *)arg.abs_value,
                        (unsigned___int128)value_00,arg.abs_value._8_4_);
    pcVar8 = fVar21.end;
LAB_0019ea27:
    aVar6 = copy_str_noinline<char,char*,fmt::v8::appender>(local_d8,pcVar8,out);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  uVar12 = (arg.prefix >> 0x18) + iVar4;
  buffer._0_8_ = ZEXT48(uVar12);
  if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
    if (uVar12 < uVar16) {
      buffer._8_8_ = (ulong)uVar16 - buffer._0_8_;
      buffer._0_8_ = (ulong)uVar16;
      goto LAB_0019e8bd;
    }
  }
  else {
    buffer._8_8_ = ZEXT48((uint)(iVar5 - iVar4));
    if (iVar5 - iVar4 != 0 && iVar4 <= iVar5) {
      buffer._0_8_ = ZEXT48(iVar5 + (arg.prefix >> 0x18));
      goto LAB_0019e8bd;
    }
  }
  buffer._8_8_ = 0;
LAB_0019e8bd:
  local_d8._0_4_ = arg.prefix;
  buffer._24_8_ = (detail *)arg.abs_value;
  stack0xffffffffffffff50 = arg.abs_value._8_8_;
  aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_)::_lambda(fmt::v8::appender)_1_&>
                    ((appender)local_38.container,specs,buffer._0_8_,buffer._0_8_,
                     (anon_class_64_3_4ecd7a16 *)local_d8);
  return (appender)
         aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}